

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O3

string * __thiscall
FastPForLib::
CompositeCodec<FastPForLib::OPTPFor<4u,FastPForLib::Simple16<false>>,FastPForLib::VariableByte>::
name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  ostringstream convert;
  string local_1d0;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined4 local_198;
  undefined1 local_194;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  OPTPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_(&local_1d0,(void *)((long)this + 8));
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"+",1);
  local_1a0 = 0x656c626169726156;
  local_198 = 0x65747942;
  local_1a8 = 0xc;
  local_194 = 0;
  local_1b0 = &local_1a0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1a0,0xc);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    std::ostringstream convert;
    convert << codec1.name() << "+" << codec2.name();
    return convert.str();
  }